

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

void compactor_shutdown(void)

{
  bool bVar1;
  avl_node *node;
  size_t i;
  openfiles_elem_conflict *elem;
  avl_node *a;
  void *ret;
  undefined8 in_stack_ffffffffffffffe0;
  __int_type_conflict1 __i;
  ulong uVar2;
  __atomic_base<unsigned_char> *in_stack_ffffffffffffffe8;
  openfiles_elem_conflict *elem_00;
  void *local_8;
  
  __i = (__int_type_conflict1)((ulong)in_stack_ffffffffffffffe0 >> 0x38);
  if (compactor_tids != (pthread_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
    std::__atomic_base<unsigned_char>::operator=(in_stack_ffffffffffffffe8,__i);
    pthread_cond_broadcast((pthread_cond_t *)&sync_cond);
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    for (uVar2 = 0; uVar2 < num_compactor_threads; uVar2 = uVar2 + 1) {
      if (compactor_tids[uVar2] != 0) {
        pthread_join(compactor_tids[uVar2],&local_8);
      }
    }
    free(compactor_tids);
    compactor_tids = (pthread_t *)0x0;
    pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
    node = avl_first(&openfiles);
    while (node != (avl_node *)0x0) {
      elem_00 = (openfiles_elem_conflict *)(node + -0x36);
      node = avl_next(node);
      bVar1 = _compactor_check_file_removal(elem_00);
      if (bVar1) {
        remove(elem_00->file->filename);
        filemgr_free_func((hash_elem *)node);
      }
      avl_remove((avl_tree *)elem,(avl_node *)i);
      free(elem_00);
    }
    sleep_duration = 0x7080;
    compactor_initialized = '\0';
    pthread_mutex_destroy((pthread_mutex_t *)&sync_mutex);
    pthread_cond_destroy((pthread_cond_t *)&sync_cond);
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    pthread_mutex_destroy((pthread_mutex_t *)&cpt_lock);
  }
  return;
}

Assistant:

void compactor_shutdown()
{
    void *ret;
    struct avl_node *a = NULL;
    struct openfiles_elem *elem;

    if (!compactor_tids) {
        return;
    }

    // set terminate signal
    mutex_lock(&sync_mutex);
    compactor_terminate_signal = 1;
    thread_cond_broadcast(&sync_cond);
    mutex_unlock(&sync_mutex);

    for (size_t i = 0; i < num_compactor_threads; ++i) {
        if (!compactor_tids[i]) continue;
        thread_join(compactor_tids[i], &ret);
    }
    free(compactor_tids);
    compactor_tids = NULL;

    mutex_lock(&cpt_lock);
    // free all elems in the tree
    a = avl_first(&openfiles);
    while (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        a = avl_next(a);

        if (_compactor_check_file_removal(elem)) {
            // remove file if removal is pended.
            remove(elem->file->filename);
            filemgr_free_func(&elem->file->e);
        }

        avl_remove(&openfiles, &elem->avl);
        free(elem);
    }

    sleep_duration = FDB_COMPACTOR_SLEEP_DURATION;
    compactor_initialized = 0;
    mutex_destroy(&sync_mutex);
    thread_cond_destroy(&sync_cond);
    mutex_unlock(&cpt_lock);

    mutex_destroy(&cpt_lock);
}